

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_FlowRetime_SetLag(Abc_Obj_t *pObj,int lag)

{
  uint uVar1;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                  ,0x53f,"void Abc_FlowRetime_SetLag(Abc_Obj_t *, int)");
  }
  uVar1 = pObj->Id;
  if ((int)uVar1 < pManMR->vLags->nSize) {
    if (-1 < (int)uVar1) {
      pManMR->vLags->pArray[uVar1] = lag;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("(int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x540,"void Abc_FlowRetime_SetLag(Abc_Obj_t *, int)");
}

Assistant:

void 
Abc_FlowRetime_SetLag( Abc_Obj_t *pObj, int lag ) {
  assert( Abc_ObjIsNode(pObj) );
  assert( (int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags) );

  Vec_IntWriteEntry(pManMR->vLags, Abc_ObjId(pObj), lag);
}